

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
EncodeAttributeConnectivitiesOnFace
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          CornerIndex corner)

{
  bool bVar1;
  size_type __n;
  MeshEdgebreakerTraversalEncoder *pMVar2;
  undefined4 in_ESI;
  long in_RDI;
  uint32_t i;
  FaceIndex opp_face_id;
  CornerIndex opp_corner;
  int c;
  FaceIndex src_face_id;
  CornerIndex corners [3];
  undefined4 in_stack_ffffffffffffff68;
  bool is_seam;
  int in_stack_ffffffffffffff6c;
  MeshEdgebreakerTraversalEncoder *in_stack_ffffffffffffff70;
  CornerTable *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  reference local_68;
  uint local_54;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_50;
  uint local_4c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_48;
  int local_44;
  reference local_40;
  undefined4 local_2c;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_28;
  undefined4 local_24;
  undefined4 local_20;
  uint local_1c [6];
  undefined4 local_4;
  
  local_4 = in_ESI;
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19ca77);
  local_20 = local_4;
  local_1c[1] = (uint)CornerTable::Next(in_stack_ffffffffffffff78,(CornerIndex)(uint)in_RDI);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19caa3);
  local_24 = local_4;
  local_1c[2] = (uint)CornerTable::Previous(in_stack_ffffffffffffff78,(CornerIndex)(uint)in_RDI);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19cacf);
  local_2c = local_4;
  local_28.value_ =
       (uint)CornerTable::Face((CornerTable *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                               (uint)in_stack_ffffffffffffff70);
  __n = in_RDI + 0x38;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_28);
  local_40 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),__n);
  std::_Bit_reference::operator=(&local_40,true);
  for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
    std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
              ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x19cb4c)
    ;
    local_4c = local_1c[local_44];
    local_48.value_ =
         (uint)CornerTable::Opposite
                         ((CornerTable *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (uint)in_stack_ffffffffffffff70);
    bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                      (&local_48,
                       (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&kInvalidCornerIndex
                      );
    if (!bVar1) {
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x19cb93);
      local_54 = local_48.value_;
      local_50.value_ =
           (uint)CornerTable::Face((CornerTable *)
                                   CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                                   (uint)in_stack_ffffffffffffff70);
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::value(&local_50);
      local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),__n);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_68);
      if (!bVar1) {
        in_stack_ffffffffffffff94 = 0;
        while( true ) {
          in_stack_ffffffffffffff70 =
               (MeshEdgebreakerTraversalEncoder *)(ulong)in_stack_ffffffffffffff94;
          pMVar2 = (MeshEdgebreakerTraversalEncoder *)
                   std::
                   vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                   ::size((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                           *)(in_RDI + 400));
          if (pMVar2 <= in_stack_ffffffffffffff70) break;
          std::
          vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
          ::operator[]((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                        *)(in_RDI + 400),(ulong)in_stack_ffffffffffffff94);
          in_stack_ffffffffffffff90 = local_1c[local_44];
          bVar1 = MeshAttributeCornerTable::IsCornerOppositeToSeamEdge
                            ((MeshAttributeCornerTable *)
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                             (CornerIndex)(uint)((ulong)in_stack_ffffffffffffff70 >> 0x20));
          is_seam = SUB41((uint)in_stack_ffffffffffffff68 >> 0x18,0);
          if (bVar1) {
            MeshEdgebreakerTraversalEncoder::EncodeAttributeSeam
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,is_seam);
          }
          else {
            MeshEdgebreakerTraversalEncoder::EncodeAttributeSeam
                      (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,is_seam);
          }
          in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<
    TraversalEncoder>::EncodeAttributeConnectivitiesOnFace(CornerIndex corner) {
  // Three corners of the face.
  const CornerIndex corners[3] = {corner, corner_table_->Next(corner),
                                  corner_table_->Previous(corner)};

  const FaceIndex src_face_id = corner_table_->Face(corner);
  visited_faces_[src_face_id.value()] = true;
  for (int c = 0; c < 3; ++c) {
    const CornerIndex opp_corner = corner_table_->Opposite(corners[c]);
    if (opp_corner == kInvalidCornerIndex) {
      continue;  // Don't encode attribute seams on boundary edges.
    }
    const FaceIndex opp_face_id = corner_table_->Face(opp_corner);
    // Don't encode edges when the opposite face has been already processed.
    if (visited_faces_[opp_face_id.value()]) {
      continue;
    }

    for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
      if (attribute_data_[i].connectivity_data.IsCornerOppositeToSeamEdge(
              corners[c])) {
        traversal_encoder_.EncodeAttributeSeam(i, true);
      } else {
        traversal_encoder_.EncodeAttributeSeam(i, false);
      }
    }
  }
  return true;
}